

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicationFolder.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
license::locate::ApplicationFolder::license_locations_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,ApplicationFolder *this,EventRegistry *eventRegistry)

{
  byte bVar1;
  FUNCTION_RETURN FVar2;
  char *pcVar3;
  int *piVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  undefined1 local_6d0 [8];
  ifstream f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  undefined1 local_4a8 [8];
  string temptativeLicense;
  string local_480;
  undefined1 local_460 [8];
  string module_name;
  char local_428 [4];
  FUNCTION_RETURN fret;
  char fname [1024];
  EventRegistry *eventRegistry_local;
  ApplicationFolder *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *diskFiles;
  
  fname[0x3ff] = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  memset(local_428,0,0x400);
  FVar2 = getModuleName(local_428);
  if (FVar2 == FUNC_RET_OK) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_480,local_428,
               (allocator *)(temptativeLicense.field_2._M_local_buf + 0xf));
    remove_extension((string *)local_460,&local_480);
    std::__cxx11::string::~string((string *)&local_480);
    std::allocator<char>::~allocator
              ((allocator<char> *)(temptativeLicense.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string((string *)&local_4c8,(string *)local_460);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8,
                   &local_4c8,".lic");
    std::__cxx11::string::~string((string *)&local_4c8);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(local_6d0,pcVar3,_S_in);
    bVar1 = std::ios::good();
    if ((bVar1 & 1) == 0) {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      EventRegistry::addEvent(eventRegistry,IFF_UP,pcVar3,(char *)0x0);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_4a8);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      EventRegistry::addEvent(eventRegistry,LICENSE_FOUND,pcVar3,(char *)0x0);
    }
    std::ifstream::close();
    std::ifstream::~ifstream(local_6d0);
    std::__cxx11::string::~string((string *)local_4a8);
    std::__cxx11::string::~string((string *)local_460);
  }
  else {
    piVar4 = __errno_location();
    __x = extraout_XMM0_Qa;
    if (*piVar4 != 0) {
      piVar4 = __errno_location();
      strerror(*piVar4);
      __x = extraout_XMM0_Qa_00;
    }
    _log(__x);
  }
  return __return_storage_ptr__;
}

Assistant:

const vector<string> ApplicationFolder::license_locations(EventRegistry &eventRegistry) {
	vector<string> diskFiles;
	char fname[MAX_PATH] = {0};
	const FUNCTION_RETURN fret = getModuleName(fname);
	if (fret == FUNC_RET_OK) {
		const string module_name = remove_extension(fname);
		const string temptativeLicense = string(module_name) + LCC_LICENSE_FILE_EXTENSION;
		ifstream f(temptativeLicense.c_str());
		if (f.good()) {
			diskFiles.push_back(temptativeLicense);
			eventRegistry.addEvent(LICENSE_FOUND, temptativeLicense.c_str());
		} else {
			eventRegistry.addEvent(LICENSE_FILE_NOT_FOUND, temptativeLicense.c_str());
		}
		f.close();
	} else {
		LOG_WARN("Error determining module name.");
	}
	return diskFiles;
}